

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

pair<bool,_bool> __thiscall
kratos::Generator::correct_wire_direction
          (Generator *this,shared_ptr<kratos::Var> *var1,shared_ptr<kratos::Var> *var2)

{
  VarType VVar1;
  VarType VVar2;
  element_type *peVar3;
  element_type *peVar4;
  Generator *pGVar5;
  pair<bool,_bool> pVar6;
  int iVar7;
  long lVar8;
  Port *pPVar9;
  Port *port2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  UserException *this_00;
  undefined4 extraout_var_05;
  VarException *pVVar11;
  undefined4 extraout_var_06;
  PortDirection PVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  Port *port1;
  ushort uVar13;
  bool bVar14;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  string local_c8;
  Port *local_a8;
  size_type local_a0;
  undefined8 uStack_98;
  shared_ptr<kratos::Var> *local_80;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  Generator *local_40;
  allocator_type local_31;
  
  peVar3 = (var1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar3 == (element_type *)0x0) ||
     (peVar4 = (var2->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar4 == (element_type *)0x0)) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Variable cannot be null (None)","");
    UserException::UserException(this_00,&local_78);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  VVar1 = peVar3->type_;
  local_40 = this;
  local_80 = var1;
  while (VVar1 == Slice) {
    lVar8 = __dynamic_cast(peVar3,&Var::typeinfo,&VarSlice::typeinfo,0);
    peVar3 = *(element_type **)(lVar8 + 0x270);
    VVar1 = peVar3->type_;
  }
  VVar2 = peVar4->type_;
  while (VVar2 == Slice) {
    lVar8 = __dynamic_cast(peVar4,&Var::typeinfo,&VarSlice::typeinfo,0);
    peVar4 = *(element_type **)(lVar8 + 0x270);
    VVar2 = peVar4->type_;
  }
  if (VVar1 == PortIO) {
    pPVar9 = (Port *)__dynamic_cast(peVar3,&Var::typeinfo,&Port::typeinfo,0);
    if (VVar2 == PortIO) {
      port2 = (Port *)__dynamic_cast(peVar4,&Var::typeinfo,&Port::typeinfo,0);
      pVar6 = correct_port_direction(pPVar9,port2,local_40);
      uVar13 = (ushort)pVar6 & 0xff00;
    }
    else {
      iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar9);
      pGVar5 = local_40;
      if ((Generator *)CONCAT44(extraout_var_01,iVar7) == local_40) {
        iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0x1d])(pPVar9);
        PVar12 = Out;
        if (((char)iVar7 != '\0') &&
           ((*(char *)(pPVar9[1].super_Var.super_IRNode._vptr_IRNode + 0x10) != '\x01' ||
            (iVar7 = (*(peVar4->super_IRNode)._vptr_IRNode[0xd])(peVar4),
            (Generator *)CONCAT44(extraout_var_04,iVar7) != pGVar5)))) {
          PVar12 = In;
        }
        bVar14 = pPVar9->direction_ == PVar12;
      }
      else {
        iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar9);
        std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::Generator,void>
                  ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                   (CONCAT44(extraout_var_02,iVar7) + 0x68));
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pGVar5->children_)._M_h,(key_type *)(local_78._M_dataplus._M_p + 0x98));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
        }
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
          iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar9);
          (*(((local_80->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0x1f])(&local_a0);
          local_78._M_dataplus._M_p = *(pointer *)(CONCAT44(extraout_var_06,iVar7) + 0x78);
          local_78._M_string_length = *(size_type *)(CONCAT44(extraout_var_06,iVar7) + 0x80);
          local_58 = (local_40->name)._M_dataplus._M_p;
          sStack_50 = (local_40->name)._M_string_length;
          local_78.field_2._M_allocated_capacity = local_a0;
          local_78.field_2._8_8_ = uStack_98;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_78;
          format_str_00.size_ = 0xddd;
          format_str_00.data_ = (char *)0x1a;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_c8,(detail *)"{0}.{1} is not part of {2}",format_str_00,args_00);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&local_a8;
          local_a8 = pPVar9;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78,__l_00,&local_31);
          VarException::VarException
                    (pVVar11,&local_c8,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78);
          __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar14 = pPVar9->direction_ == In;
      }
      pVar6.second = false;
      pVar6.first = bVar14;
      uVar13 = 0x100;
    }
  }
  else {
    uVar13 = 0x100;
    pVar6.first = true;
    pVar6.second = false;
    if (VVar2 == PortIO) {
      pPVar9 = (Port *)__dynamic_cast(peVar4,&Var::typeinfo,&Port::typeinfo,0);
      iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar9);
      pGVar5 = local_40;
      if ((Generator *)CONCAT44(extraout_var,iVar7) == local_40) {
        iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0x1d])(pPVar9);
        if ((char)iVar7 == '\0') {
          PVar12 = In;
        }
        else {
          PVar12 = In;
          if ((*(char *)(pPVar9[1].super_Var.super_IRNode._vptr_IRNode + 0x10) != '\x01') ||
             (iVar7 = (*(peVar3->super_IRNode)._vptr_IRNode[0xd])(peVar3),
             (Generator *)CONCAT44(extraout_var_03,iVar7) != pGVar5)) {
            PVar12 = Out;
          }
        }
        bVar14 = pPVar9->direction_ == PVar12;
      }
      else {
        iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar9);
        std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::Generator,void>
                  ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                   (CONCAT44(extraout_var_00,iVar7) + 0x68));
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pGVar5->children_)._M_h,(key_type *)(local_78._M_dataplus._M_p + 0x98));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
        }
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
          iVar7 = (*(pPVar9->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar9);
          (*(((local_80->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0x1f])(&local_a0);
          local_78._M_dataplus._M_p = *(pointer *)(CONCAT44(extraout_var_05,iVar7) + 0x78);
          local_78._M_string_length = *(size_type *)(CONCAT44(extraout_var_05,iVar7) + 0x80);
          local_58 = (local_40->name)._M_dataplus._M_p;
          sStack_50 = (local_40->name)._M_string_length;
          local_78.field_2._M_allocated_capacity = local_a0;
          local_78.field_2._8_8_ = uStack_98;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_78;
          format_str.size_ = 0xddd;
          format_str.data_ = (char *)0x1a;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_c8,(detail *)"{0}.{1} is not part of {2}",format_str,args);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_a8;
          local_a8 = pPVar9;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78,__l,&local_31);
          VarException::VarException
                    (pVVar11,&local_c8,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78);
          __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar14 = pPVar9->direction_ == Out;
      }
      pVar6.second = false;
      pVar6.first = bVar14;
    }
  }
  return (pair<bool,_bool>)(uVar13 | (ushort)pVar6 & 0xff);
}

Assistant:

std::pair<bool, bool> Generator::correct_wire_direction(const std::shared_ptr<Var> &var1,
                                                        const std::shared_ptr<Var> &var2) {
    if (!var1 || !var2) throw UserException("Variable cannot be null (None)");
    Var *root1 = var1.get();
    while (root1->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root1);
        root1 = var->parent_var;
    }
    Var *root2 = var2.get();
    while (root2->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root2);
        root2 = var->parent_var;
    }
    if (root1->type() != VarType::PortIO && root2->type() != VarType::PortIO) {
        // there is nothing we can do
        return {true, true};
    } else if (root1->type() == VarType::PortIO && root2->type() != VarType::PortIO) {
        // var1 is port and var2 is not
        auto *port1 = dynamic_cast<Port *>(root1);
        if (port1->generator() == this) {
            bool flip_dir = false;
            if (port1->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port1);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root2->generator() == this);
            }
            return {!flip_dir ? port1->port_direction() == PortDirection::Out
                              : port1->port_direction() == PortDirection::In,
                    true};
        } else {
            if (!has_child_generator(port1->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port1->generator()->name,
                                            var1->to_string(), name),
                                   {port1});
            }
            // child generator, reverse order
            return {port1->port_direction() == PortDirection::In, true};
        }
    } else if (root2->type() == VarType::PortIO && root1->type() != VarType::PortIO) {
        // var2 is port and var1 is not
        auto *port2 = dynamic_cast<Port *>(root2);
        if (port2->generator() == this) {
            bool flip_dir = false;
            if (port2->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port2);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root1->generator() == this);
            }
            return {!flip_dir ? port2->port_direction() == PortDirection::In
                              : port2->port_direction() == PortDirection::Out,
                    true};
        } else {
            if (!has_child_generator(port2->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port2->generator()->name,
                                            var1->to_string(), name),
                                   {port2});
            }
            // child generator, reverse order
            return {port2->port_direction() == PortDirection::Out, true};
        }
    } else {
        // both are ports
        auto *port1 = dynamic_cast<Port *>(root1);
        auto *port2 = dynamic_cast<Port *>(root2);
        return correct_port_direction(port1, port2, this);
    }
}